

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O2

void __thiscall baryonyx::pnm_vector::pnm_vector(pnm_vector *this,string *filename,uint m,long loop)

{
  char cVar1;
  pointer __p_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  ulong uVar2;
  pointer __p;
  basic_string_view<char> bVar3;
  format_args args;
  string_view format_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  __uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> local_58 [2];
  long local_48;
  undefined8 local_38;
  
  (this->m_buffer)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  std::ofstream::ofstream(&this->m_ofs,(string *)filename,_S_bin);
  this->m_heigth = loop;
  uVar2 = (ulong)m;
  this->m_width = uVar2;
  cVar1 = std::__basic_file<char>::is_open();
  if ((cVar1 != '\0') && (0 < (long)(loop * uVar2))) {
    __p_00 = (pointer)operator_new__(uVar2 * 3);
    memset(__p_00,0,uVar2 * 3);
    local_58[0]._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
         (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)0x0;
    std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>::reset
              ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_> *)this,__p_00)
    ;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)local_58);
    local_48 = this->m_heigth;
    local_58[0]._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_>)this->m_width;
    local_38 = 0xff;
    bVar3 = ::fmt::v7::to_string_view<char,_0>("P6 {} {} {} ");
    format_str.data_ = (char *)bVar3.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_58;
    format_str.size_ = 0x133;
    ::fmt::v7::detail::vformat_abi_cxx11_(&header,(detail *)bVar3.data_,format_str,args);
    std::operator<<((ostream *)&this->m_ofs,(string *)&header);
    std::__cxx11::string::~string((string *)&header);
  }
  return;
}

Assistant:

pnm_vector(std::string filename, unsigned int m, long int loop)
      : m_ofs(filename, std::ios::binary)
      , m_heigth(loop)
      , m_width(m)
    {
        if (!m_ofs.is_open())
            return;

        if (m_heigth * m_width > 0) {
            m_buffer = std::make_unique<std::uint8_t[]>(size());

            auto header{ fmt::format("P6 {} {} {} ", m_width, m_heigth, 255) };
            m_ofs << header;
        }
    }